

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiViewportP_*> *this;
  ImVector<ImGuiViewport_*> *this_00;
  ImVector<ImGuiWindow_*> *pIVar1;
  ImVector<ImGuiWindow_*> *this_01;
  ImVec2 IVar2;
  ImVec2 IVar3;
  uint move_flags;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow *pIVar6;
  char *text;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  ImGuiKeyModFlags IVar16;
  ImU32 IVar17;
  undefined4 extraout_EAX;
  int iVar18;
  ImGuiWindow *pIVar19;
  ImGuiViewportP **ppIVar20;
  ImDrawList *pIVar21;
  ImGuiWindow **ppIVar22;
  ImGuiViewport *pIVar23;
  char *pcVar24;
  ImVec2 *pIVar25;
  ImGuiContext *g_1;
  long lVar26;
  ImGuiContext *g;
  int i;
  char *label;
  int viewport_n;
  int iVar27;
  ImGuiContext *pIVar28;
  ImGuiWindow *window;
  ImGuiDir clip_dir;
  uint uVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar30;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar31;
  ImRect IVar32;
  ImRect inner;
  ImRect local_a8;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  ImGuiContext *local_80;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar28 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1188,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x118d,"void ImGui::EndFrame()");
  }
  CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
  pIVar9 = GImGui;
  IVar16 = GetMergedKeyModFlags();
  if ((IVar16 != 0) && ((pIVar9->IO).KeyMods != IVar16)) {
    __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1df1,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar27 = (pIVar9->CurrentWindowStack).Size;
  if (iVar27 != 1) {
    if (1 < iVar27) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                    ,0x1dfd,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1e03,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if ((pIVar9->GroupStack).Size != 0) {
    __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1e07,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var4 = (pIVar28->PlatformIO).Platform_SetImeInputPos;
  if (p_Var4 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
    fVar30 = (pIVar28->PlatformImeLastPos).x;
    if ((fVar30 != 3.4028235e+38) || (NAN(fVar30))) {
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      fVar30 = (pIVar28->PlatformImePos).x - fVar30;
      fVar31 = (pIVar28->PlatformImePos).y - (pIVar28->PlatformImeLastPos).y;
      if (fVar30 * fVar30 + fVar31 * fVar31 <= 0.0001) goto LAB_002efe20;
    }
    pIVar5 = pIVar28->PlatformImePosViewport;
    if ((pIVar5 != (ImGuiViewportP *)0x0) && (pIVar5->PlatformWindowCreated == true)) {
      (*p_Var4)(&pIVar5->super_ImGuiViewport,pIVar28->PlatformImePos);
      pIVar28->PlatformImeLastPos = pIVar28->PlatformImePos;
      pIVar28->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
  }
LAB_002efe20:
  pIVar28->WithinFrameScopeWithImplicitWindow = false;
  pIVar19 = pIVar28->CurrentWindow;
  if ((pIVar19 != (ImGuiWindow *)0x0) && (pIVar19->WriteAccessed == false)) {
    pIVar19->Active = false;
  }
  End();
  pIVar9 = GImGui;
  pIVar19 = GetTopMostPopupModal();
  if (pIVar19 != (ImGuiWindow *)0x0 || pIVar9->NavWindowingTargetAnim != (ImGuiWindow *)0x0) {
    local_78 = (undefined1  [8])pIVar9->NavWindowingTargetAnim;
    local_80 = pIVar28;
    local_98._0_4_ = 0x36 - (uint)(pIVar19 == (ImGuiWindow *)0x0);
    for (iVar27 = 0; iVar27 < (pIVar9->Viewports).Size; iVar27 = iVar27 + 1) {
      ppIVar20 = ImVector<ImGuiViewportP_*>::operator[](&pIVar9->Viewports,iVar27);
      pIVar5 = *ppIVar20;
      if (((((pIVar19 == (ImGuiWindow *)0x0) || (pIVar5 != pIVar19->Viewport)) &&
           ((pIVar9->NavWindowingListWindow == (ImGuiWindow *)0x0 ||
            (pIVar5 != pIVar9->NavWindowingListWindow->Viewport)))) &&
          ((pIVar9->NavWindowingTargetAnim == (ImGuiWindow *)0x0 ||
           (pIVar5 != pIVar9->NavWindowingTargetAnim->Viewport)))) &&
         ((pIVar19 == (ImGuiWindow *)0x0 ||
          ((pIVar5->Window == (ImGuiWindow *)0x0 ||
           (bVar14 = IsWindowAbove(pIVar5->Window,pIVar19), !bVar14)))))) {
        pIVar21 = GetForegroundDrawList(&pIVar5->super_ImGuiViewport);
        IVar17 = GetColorU32(local_98._0_4_,pIVar9->DimBgRatio);
        IVar2 = (pIVar5->super_ImGuiViewport).Pos;
        IVar3 = (pIVar5->super_ImGuiViewport).Size;
        in_XMM1_Dc = 0;
        in_XMM1_Dd = 0;
        local_a8.Min.y = IVar3.y + IVar2.y;
        local_a8.Min.x = IVar3.x + IVar2.x;
        ImDrawList::AddRectFilled
                  (pIVar21,&(pIVar5->super_ImGuiViewport).Pos,&local_a8.Min,IVar17,0.0,0xf);
      }
    }
    pIVar28 = local_80;
    if ((local_78 != (undefined1  [8])0x0) &&
       (pIVar19 = pIVar9->NavWindowingTargetAnim, pIVar19->Active == true)) {
      ppIVar22 = &pIVar19->RootWindow;
      local_98 = (undefined1  [8])ppIVar22;
      do {
        pIVar6 = *ppIVar22;
        pIVar1 = &(pIVar6->DC).ChildWindows;
        iVar27 = (pIVar6->DC).ChildWindows.Size;
        do {
          iVar18 = iVar27;
          if (iVar18 < 1) {
            pIVar21 = pIVar6->DrawList;
            ImDrawList::PushClipRectFullScreen(pIVar21);
            if ((pIVar19->RootWindowDockStop->field_0x452 & 1) != 0) {
              if (*(ImGuiWindow **)local_98 != pIVar19->RootWindowDockStop) {
                IVar32 = ImGuiWindow::Rect(*(ImGuiWindow **)local_98);
                fStack_90 = (float)extraout_XMM0_Dc;
                local_98._0_4_ = IVar32.Min.x;
                local_98._4_4_ = IVar32.Min.y;
                fStack_8c = (float)extraout_XMM0_Dd;
                fStack_70 = (float)in_XMM1_Dc;
                local_78._0_4_ = IVar32.Max.x;
                local_78._4_4_ = IVar32.Max.y;
                fStack_6c = (float)in_XMM1_Dd;
                IVar32 = ImGuiWindow::Rect(pIVar19->RootWindowDockStop);
                local_58._8_4_ = extraout_XMM0_Dc_00;
                local_58._0_4_ = IVar32.Min.x;
                local_58._4_4_ = IVar32.Min.y;
                local_58._12_4_ = extraout_XMM0_Dd_00;
                local_68._8_4_ = in_XMM1_Dc;
                local_68._0_4_ = IVar32.Max.x;
                local_68._4_4_ = IVar32.Max.y;
                local_68._12_4_ = in_XMM1_Dd;
                IVar17 = GetColorU32(0x35,pIVar9->DimBgRatio);
                auVar13 = local_58;
                auVar12 = local_68;
                auVar11 = _local_78;
                auVar8 = _local_98;
                IVar32.Max.x = (float)local_78._0_4_;
                IVar32.Max.y = (float)local_78._4_4_;
                IVar32.Min.x = (float)local_98._0_4_;
                IVar32.Min.y = (float)local_98._4_4_;
                inner.Max.x = (float)local_68._0_4_;
                inner.Max.y = (float)local_68._4_4_;
                inner.Min.x = (float)local_58._0_4_;
                inner.Min.y = (float)local_58._4_4_;
                _local_98 = auVar8;
                _local_78 = auVar11;
                local_68 = auVar12;
                local_58 = auVar13;
                RenderRectFilledWithHole(pIVar21,IVar32,inner,IVar17,(pIVar9->Style).WindowRounding)
                ;
              }
            }
            local_58 = ZEXT416((uint)pIVar19->WindowRounding);
            local_68 = ZEXT416((uint)(pIVar9->Style).WindowRounding);
            IVar32 = ImGuiWindow::Rect(pIVar19);
            fVar30 = pIVar9->FontSize;
            local_48 = IVar32.Min.x - fVar30;
            fStack_44 = IVar32.Min.y - fVar30;
            local_78._4_4_ = fStack_44;
            local_78._0_4_ = local_48;
            fStack_70 = IVar32.Max.x - fVar30;
            fStack_6c = IVar32.Max.y - fVar30;
            fStack_40 = fVar30 + IVar32.Max.x;
            fStack_3c = fVar30 + IVar32.Max.y;
            local_98._4_4_ = fVar30 + IVar32.Min.y;
            local_98._0_4_ = fVar30 + IVar32.Min.x;
            fStack_90 = fStack_40;
            fStack_8c = fStack_3c;
            local_a8.Min.y = fStack_44;
            local_a8.Min.x = local_48;
            local_a8.Max.y = fStack_3c;
            local_a8.Max.x = fStack_40;
            IVar32 = ImGuiViewportP::GetMainRect(pIVar19->Viewport);
            pIVar28 = local_80;
            auVar8._4_4_ = -(uint)(IVar32.Max.y <= fStack_8c);
            auVar8._0_4_ = -(uint)(IVar32.Max.x <= fStack_90);
            auVar8._8_4_ = -(uint)(local_78._0_4_ <= IVar32.Min.x);
            auVar8._12_4_ = -(uint)(local_78._4_4_ <= IVar32.Min.y);
            iVar27 = movmskps(extraout_EAX,auVar8);
            if (iVar27 == 0xf) {
              fVar30 = -1.0 - pIVar9->FontSize;
              local_a8.Min.y = fStack_44 - fVar30;
              local_a8.Min.x = local_48 - fVar30;
              local_a8.Max.y = fVar30 + fStack_3c;
              local_a8.Max.x = fVar30 + fStack_40;
              _local_98 = ZEXT416((uint)pIVar19->WindowRounding);
            }
            else {
              local_98._4_4_ = local_58._4_4_ & local_68._4_4_;
              local_98._0_4_ =
                   ~-(uint)((float)local_68._0_4_ <= (float)local_58._0_4_) & local_68._0_4_ |
                   local_58._0_4_ & -(uint)((float)local_68._0_4_ <= (float)local_58._0_4_);
              fStack_90 = (float)(local_58._8_4_ & local_68._8_4_);
              fStack_8c = (float)(local_58._12_4_ & local_68._12_4_);
            }
            IVar17 = GetColorU32(0x34,pIVar9->NavWindowingHighlightAlpha);
            ImDrawList::AddRect(pIVar21,&local_a8.Min,&local_a8.Max,IVar17,(float)local_98._0_4_,-1,
                                3.0);
            ImDrawList::PopClipRect(pIVar21);
            goto LAB_002f0161;
          }
          iVar27 = iVar18 + -1;
          ppIVar22 = ImVector<ImGuiWindow_*>::operator[](pIVar1,iVar27);
        } while (((*ppIVar22)->Active != true) || ((*ppIVar22)->Hidden == true));
        ppIVar22 = ImVector<ImGuiWindow_*>::operator[](pIVar1,iVar18 + -1);
      } while( true );
    }
  }
LAB_002f0161:
  pIVar9 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar19 = FindWindowByName("###NavWindowingList");
      pIVar9->NavWindowingListWindow = pIVar19;
    }
    local_80 = pIVar28;
    pIVar23 = GetMainViewport();
    pIVar28 = GImGui;
    IVar2.y = (pIVar23->Size).y * 0.2;
    IVar2.x = (pIVar23->Size).x * 0.2;
    (GImGui->NextWindowData).SizeConstraintRect.Min = IVar2;
    (pIVar28->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar28->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar28->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar28->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar2 = pIVar23->Pos;
    IVar3 = pIVar23->Size;
    (pIVar28->NextWindowData).Flags = (pIVar28->NextWindowData).Flags | 0x11;
    IVar7.y = IVar3.y * 0.5 + IVar2.y;
    IVar7.x = IVar3.x * 0.5 + IVar2.x;
    (pIVar28->NextWindowData).PosVal = IVar7;
    (pIVar28->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar28->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar28->NextWindowData).PosCond = 1;
    (pIVar28->NextWindowData).PosUndock = true;
    IVar2 = (pIVar9->Style).WindowPadding;
    fVar30 = IVar2.x;
    fVar31 = IVar2.y;
    local_a8.Min.y = fVar31 + fVar31;
    local_a8.Min.x = fVar30 + fVar30;
    PushStyleVar(1,&local_a8.Min);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    iVar27 = (pIVar9->WindowsFocusOrder).Size;
    while (0 < iVar27) {
      iVar27 = iVar27 + -1;
      ppIVar22 = ImVector<ImGuiWindow_*>::operator[](&pIVar9->WindowsFocusOrder,iVar27);
      pIVar19 = *ppIVar22;
      bVar14 = IsWindowNavFocusable(pIVar19);
      if (bVar14) {
        text = pIVar19->Name;
        pcVar24 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar24) {
          label = "(Popup)";
          if (((uint)pIVar19->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar19->Flags >> 10 & 1) != 0) {
              iVar18 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar18 == 0) goto LAB_002f02ed;
            }
            label = "(Dock node)";
            if (pIVar19->DockNodeAsHost == (ImGuiDockNode *)0x0) {
              label = "(Untitled)";
            }
          }
        }
LAB_002f02ed:
        local_a8.Min.x = 0.0;
        local_a8.Min.y = 0.0;
        Selectable(label,pIVar9->NavWindowingTarget == pIVar19,0,&local_a8.Min);
      }
    }
    End();
    PopStyleVar(1);
    pIVar28 = local_80;
  }
  pIVar19 = pIVar9->NavWrapRequestWindow;
  if ((pIVar19 != (ImGuiWindow *)0x0) && (pIVar9->NavWindow == pIVar19)) {
    move_flags = pIVar9->NavWrapRequestFlags;
    bVar14 = NavMoveRequestButNoResultYet();
    if ((bVar14) &&
       ((pIVar9->NavMoveRequestForward == ImGuiNavForward_None &&
        (pIVar9->NavLayer == ImGuiNavLayer_Main)))) {
      if (move_flags == 0) {
        __assert_fail("move_flags != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                      ,0x26c5,"void ImGui::NavEndFrame()");
      }
      local_a8.Min = pIVar19->NavRectRel[0].Min;
      local_a8.Max = pIVar19->NavRectRel[0].Max;
      iVar27 = pIVar9->NavMoveDir;
      clip_dir = iVar27;
      if (iVar27 == 0) {
        if ((move_flags & 5) != 0) {
          fVar30 = (pIVar19->SizeFull).x;
          fVar31 = (pIVar19->WindowPadding).x;
          fVar31 = fVar31 + fVar31 + (pIVar19->ContentSize).x;
          uVar29 = -(uint)(fVar31 <= fVar30);
          fVar30 = (float)(uVar29 & (uint)fVar30 | ~uVar29 & (uint)fVar31) - (pIVar19->Scroll).x;
          clip_dir = 0;
          if ((move_flags & 4) != 0) {
            fVar31 = local_a8.Max.y - local_a8.Min.y;
            local_a8.Min.y = local_a8.Min.y - fVar31;
            local_a8.Max.y = local_a8.Max.y - fVar31;
            clip_dir = 2;
          }
          local_a8.Max.x = fVar30;
          local_a8.Min.x = fVar30;
          NavMoveRequestForward(0,clip_dir,&local_a8,move_flags);
          iVar27 = pIVar9->NavMoveDir;
          goto LAB_002f042f;
        }
        iVar27 = 0;
        clip_dir = 0;
      }
      else {
LAB_002f042f:
        if (iVar27 == 1 && (move_flags & 5) != 0) {
          fVar30 = (pIVar19->Scroll).x;
          fVar10 = local_a8.Max.y;
          local_a8.Max = (ImVec2)(CONCAT44(local_a8.Max.y,fVar30) ^ 0x80000000);
          fVar31 = local_a8.Min.y;
          local_a8.Min = (ImVec2)(CONCAT44(local_a8.Min.y,fVar30) ^ 0x80000000);
          if ((move_flags & 4) != 0) {
            fVar30 = fVar10 - fVar31;
            local_a8.Min.y = fVar31 + fVar30;
            local_a8.Max.y = fVar30 + fVar10;
            clip_dir = 3;
          }
          NavMoveRequestForward(1,clip_dir,&local_a8,move_flags);
          iVar27 = pIVar9->NavMoveDir;
        }
      }
      if ((move_flags & 10) != 0 && iVar27 == 2) {
        fVar30 = (pIVar19->SizeFull).y;
        fVar31 = (pIVar19->WindowPadding).y;
        fVar31 = fVar31 + fVar31 + (pIVar19->ContentSize).y;
        uVar29 = -(uint)(fVar31 <= fVar30);
        fVar30 = (float)(uVar29 & (uint)fVar30 | ~uVar29 & (uint)fVar31) - (pIVar19->Scroll).y;
        if ((move_flags & 8) != 0) {
          fVar31 = local_a8.Max.x - local_a8.Min.x;
          local_a8.Min.x = local_a8.Min.x - fVar31;
          local_a8.Max.x = local_a8.Max.x - fVar31;
          clip_dir = 0;
        }
        local_a8.Max.y = fVar30;
        local_a8.Min.y = fVar30;
        NavMoveRequestForward(2,clip_dir,&local_a8,move_flags);
        iVar27 = pIVar9->NavMoveDir;
      }
      if (iVar27 == 3 && (move_flags & 10) != 0) {
        fVar30 = (pIVar19->Scroll).y;
        fVar10 = local_a8.Max.x;
        local_a8.Max = (ImVec2)(CONCAT44(fVar30,local_a8.Max.x) ^ 0x8000000000000000);
        fVar31 = local_a8.Min.x;
        local_a8.Min = (ImVec2)(CONCAT44(fVar30,local_a8.Min.x) ^ 0x8000000000000000);
        if ((move_flags & 8) != 0) {
          clip_dir = 1;
          fVar30 = fVar10 - fVar31;
          local_a8.Min.x = fVar31 + fVar30;
          local_a8.Max.x = fVar30 + fVar10;
        }
        NavMoveRequestForward(3,clip_dir,&local_a8,move_flags);
      }
    }
  }
  pIVar9 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar9->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  if (pIVar28->DragDropActive != true) goto LAB_002f0628;
  bVar14 = (pIVar28->DragDropPayload).Delivery;
  if ((pIVar28->DragDropPayload).DataFrameCount + 1 < pIVar28->FrameCount) {
    if ((pIVar28->DragDropSourceFlags & 0x20) == 0) {
      bVar15 = IsMouseDown(pIVar28->DragDropMouseButton);
      bVar15 = !bVar15;
      goto LAB_002f061b;
    }
  }
  else {
    bVar15 = false;
LAB_002f061b:
    if ((!bVar15) && (bVar14 == false)) goto LAB_002f0628;
  }
  ClearDragDrop();
LAB_002f0628:
  iVar27 = pIVar28->FrameCount;
  if (((pIVar28->DragDropActive == true) && (pIVar28->DragDropSourceFrameCount < iVar27)) &&
     ((pIVar28->DragDropSourceFlags & 1) == 0)) {
    pIVar28->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar28->DragDropWithinSource = false;
    iVar27 = pIVar28->FrameCount;
  }
  pIVar28->WithinFrameScope = false;
  pIVar28->FrameCountEnded = iVar27;
  UpdateMouseMovingWindowEndFrame();
  pIVar9 = GImGui;
  this = &GImGui->Viewports;
  iVar27 = 0;
  ppIVar20 = ImVector<ImGuiViewportP_*>::operator[](this,0);
  (pIVar9->PlatformIO).MainViewport = &(*ppIVar20)->super_ImGuiViewport;
  this_00 = &(pIVar9->PlatformIO).Viewports;
  ImVector<ImGuiViewport_*>::resize(this_00,0);
  do {
    if (this->Size <= iVar27) {
      ppIVar20 = ImVector<ImGuiViewportP_*>::operator[](this,0);
      pIVar5 = *ppIVar20;
      (pIVar5->super_ImGuiViewport).PlatformRequestMove = false;
      (pIVar5->super_ImGuiViewport).PlatformRequestResize = false;
      (pIVar5->super_ImGuiViewport).PlatformRequestClose = false;
      pIVar1 = &pIVar28->WindowsTempSortBuffer;
      ImVector<ImGuiWindow_*>::resize(pIVar1,0);
      this_01 = &pIVar28->Windows;
      ImVector<ImGuiWindow_*>::reserve(pIVar1,(pIVar28->Windows).Size);
      for (iVar27 = 0; iVar27 != this_01->Size; iVar27 = iVar27 + 1) {
        ppIVar22 = ImVector<ImGuiWindow_*>::operator[](this_01,iVar27);
        pIVar19 = *ppIVar22;
        if ((pIVar19->Active != true) || ((pIVar19->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(pIVar1,pIVar19);
        }
      }
      if (pIVar1->Size == iVar27) {
        ImVector<ImGuiWindow_*>::swap(this_01,pIVar1);
        (pIVar28->IO).MetricsActiveWindows = pIVar28->WindowsActiveCount;
        ((pIVar28->IO).Fonts)->Locked = false;
        (pIVar28->IO).MouseWheel = 0.0;
        (pIVar28->IO).MouseWheelH = 0.0;
        ImVector<unsigned_short>::resize(&(pIVar28->IO).InputQueueCharacters,0);
        (pIVar28->IO).NavInputs[0x10] = 0.0;
        (pIVar28->IO).NavInputs[0x11] = 0.0;
        (pIVar28->IO).NavInputs[0x12] = 0.0;
        (pIVar28->IO).NavInputs[0x13] = 0.0;
        (pIVar28->IO).NavInputs[0xc] = 0.0;
        (pIVar28->IO).NavInputs[0xd] = 0.0;
        (pIVar28->IO).NavInputs[0xe] = 0.0;
        (pIVar28->IO).NavInputs[0xf] = 0.0;
        (pIVar28->IO).NavInputs[8] = 0.0;
        (pIVar28->IO).NavInputs[9] = 0.0;
        (pIVar28->IO).NavInputs[10] = 0.0;
        (pIVar28->IO).NavInputs[0xb] = 0.0;
        (pIVar28->IO).NavInputs[4] = 0.0;
        (pIVar28->IO).NavInputs[5] = 0.0;
        (pIVar28->IO).NavInputs[6] = 0.0;
        (pIVar28->IO).NavInputs[7] = 0.0;
        (pIVar28->IO).NavInputs[0] = 0.0;
        (pIVar28->IO).NavInputs[1] = 0.0;
        (pIVar28->IO).NavInputs[2] = 0.0;
        (pIVar28->IO).NavInputs[3] = 0.0;
        (pIVar28->IO).NavInputs[0x14] = 0.0;
        CallContextHooks(pIVar28,ImGuiContextHookType_EndFramePost);
        return;
      }
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                    ,0x11d2,"void ImGui::EndFrame()");
    }
    pIVar25 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](this,iVar27);
    IVar2 = *pIVar25;
    *(undefined8 *)((long)IVar2 + 0x7c) = *(undefined8 *)((long)IVar2 + 8);
    if ((*(int *)((long)IVar2 + 0x68) < pIVar9->FrameCount) ||
       (*(float *)((long)IVar2 + 0x10) <= 0.0)) {
      if (iVar27 == 0) {
        lVar26 = *(long *)((long)IVar2 + 0x90);
        if (lVar26 != 0) goto LAB_002f071a;
        goto LAB_002f072c;
      }
    }
    else if ((iVar27 == 0) || (0.0 < *(float *)((long)IVar2 + 0x14))) {
      lVar26 = *(long *)((long)IVar2 + 0x90);
      if (lVar26 == 0) {
        if (iVar27 != 0) {
          __assert_fail("viewport->Window != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                        ,0x2cad,"void ImGui::UpdateViewportsEndFrame()");
        }
      }
      else {
LAB_002f071a:
        if ((*(char *)(lVar26 + 0xbf) != '\x01') || (*(char *)(lVar26 + 0xc6) != '\0'))
        goto LAB_002f073b;
      }
LAB_002f072c:
      local_a8.Min = IVar2;
      ImVector<ImGuiViewport_*>::push_back(this_00,(ImGuiViewport **)&local_a8);
    }
LAB_002f073b:
    iVar27 = iVar27 + 1;
  } while( true );
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}